

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

void __thiscall Graph::prohibitTransition(Graph *this,int left,int mid,int right)

{
  pointer *pppEVar1;
  pointer pvVar2;
  pointer ppEVar3;
  Edge *pEVar4;
  Edge *pEVar5;
  bool bVar6;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> _Var7;
  pointer ppEVar8;
  Edge *rightEdge;
  Edge *leftEdge;
  Edge *local_38;
  Edge *local_30;
  
  pvVar2 = (this->adjList).
           super__Vector_base<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppEVar3 = *(pointer *)
             ((long)&pvVar2[mid].super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl + 8);
  pEVar4 = local_30;
  for (ppEVar8 = *(pointer *)
                  &pvVar2[mid].super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl;
      local_30 = pEVar4, ppEVar8 != ppEVar3; ppEVar8 = ppEVar8 + 1) {
    pEVar4 = *ppEVar8;
    bVar6 = Edge::connectsTo(pEVar4,left);
    if (bVar6) {
      local_30 = pEVar4;
    }
    bVar6 = Edge::connectsTo(pEVar4,right);
    if (bVar6) {
      local_38 = pEVar4;
    }
    pEVar4 = local_30;
  }
  _Var7 = std::
          __find_if<__gnu_cxx::__normal_iterator<Edge**,std::vector<Edge*,std::allocator<Edge*>>>,__gnu_cxx::__ops::_Iter_equals_val<Edge*const>>
                    ((pEVar4->neighbours).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (pEVar4->neighbours).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_38);
  ppEVar8 = _Var7._M_current + 1;
  ppEVar3 = (pEVar4->neighbours).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppEVar8 != ppEVar3) {
    memmove(_Var7._M_current,ppEVar8,(long)ppEVar3 - (long)ppEVar8);
  }
  pEVar5 = local_38;
  pppEVar1 = &(pEVar4->neighbours).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  *pppEVar1 = *pppEVar1 + -1;
  _Var7 = std::
          __find_if<__gnu_cxx::__normal_iterator<Edge**,std::vector<Edge*,std::allocator<Edge*>>>,__gnu_cxx::__ops::_Iter_equals_val<Edge*const>>
                    ((local_38->neighbours).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (local_38->neighbours).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_30);
  ppEVar8 = _Var7._M_current + 1;
  ppEVar3 = (pEVar5->neighbours).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppEVar8 != ppEVar3) {
    memmove(_Var7._M_current,ppEVar8,(long)ppEVar3 - (long)ppEVar8);
  }
  pppEVar1 = &(pEVar5->neighbours).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  *pppEVar1 = *pppEVar1 + -1;
  return;
}

Assistant:

void Graph::prohibitTransition(int left, int mid, int right) {
  Edge* leftEdge;
  Edge* rightEdge;
  for(Edge* edge: adjList[mid]) {
    if(edge->connectsTo(left)) leftEdge = edge;
    if(edge->connectsTo(right)) rightEdge = edge;
  }
  leftEdge->neighbours.erase(std::find(leftEdge->neighbours.begin(), leftEdge->neighbours.end(), rightEdge));
  rightEdge->neighbours.erase(std::find(rightEdge->neighbours.begin(), rightEdge->neighbours.end(), leftEdge));
}